

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O1

Gia_Man_t * Gia_ManCheckFalse(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  int *__ptr;
  void *__s;
  Vec_Int_t *pVVar6;
  Gia_Man_t *p_01;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  uint local_4c;
  
  p_00 = Gia_ManDup(p);
  iVar3 = p_00->vCos->nSize;
  __ptr = (int *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  __ptr[1] = 0;
  *__ptr = iVar4;
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = iVar3;
  memset(__s,0,(long)iVar3 << 2);
  local_4c = 0;
  uVar9 = 0;
  do {
    iVar3 = Gia_ManLevelNum(p_00);
    pVVar6 = p_00->vCos;
    uVar5 = uVar9;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        iVar4 = pVVar6->pArray[lVar10];
        if (((long)iVar4 < 0) || (p_00->nObjs <= iVar4)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = p_00->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        pGVar1 = pGVar2 + iVar4;
        uVar7 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
        if ((~*(uint *)(pGVar1 + -uVar7) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar1 + -uVar7))
        {
          pGVar8 = pGVar1 + -uVar7;
          if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) {
LAB_006d67cd:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = Gia_ObjLevelId(p_00,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555
                                );
          if (iVar3 - nSlackMax <= iVar4) {
            if (__ptr[1] <= lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*(int *)(*(long *)(__ptr + 2) + lVar10 * 4) == 0) {
              pGVar2 = p_00->pObjs;
              if ((pGVar1 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar1)) goto LAB_006d67cd;
              local_4c = local_4c + 1;
              p_01 = Gia_ManCheckOne(p_00,(int)lVar10,
                                     (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555
                                     - (*(uint *)pGVar1 & 0x1fffffff),nTimeOut,fVerbose,fVeryVerbose
                                    );
              if (p_01 == (Gia_Man_t *)0x0) {
                if (__ptr[1] <= lVar10) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                *(undefined4 *)(*(long *)(__ptr + 2) + lVar10 * 4) = 1;
              }
              else {
                uVar5 = uVar5 + 1;
                Gia_ManStop(p_00);
                iVar3 = Gia_ManLevelNum(p_01);
                p_00 = p_01;
              }
            }
          }
        }
        lVar10 = lVar10 + 1;
        pVVar6 = p_00->vCos;
      } while (lVar10 < pVVar6->nSize);
    }
    bVar11 = uVar9 == uVar5;
    uVar9 = uVar5;
    if (bVar11) {
      printf("Performed %d attempts and %d changes.\n",(ulong)local_4c,(ulong)uVar5);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return p_00;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    Vec_Int_t * vTried;
//    srand( 111 );
    p = Gia_ManDup( p );
    vTried = Vec_IntStart( Gia_ManCoNum(p) );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachCo( p, pObj, i )
        {
            if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                continue;
            if ( Gia_ObjLevel(p, Gia_ObjFanin0(pObj)) < LevelMax - nSlackMax )
                continue;
            if ( Vec_IntEntry( vTried, i ) )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, i, Gia_ObjFaninId0p(p, pObj), nTimeOut, fVerbose, fVeryVerbose );
/*
            if ( i != 126 && pNew )
            {
                Gia_ManStop( pNew );
                pNew = NULL;
            }
*/
            if ( pNew == NULL )
            {
                Vec_IntWriteEntry( vTried, i, 1 );
                continue;
            }
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    Vec_IntFree( vTried );
    return p;
}